

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes2.cc
# Opt level: O2

int __thiscall Node::IsNumber(Node *this)

{
  uint uVar1;
  int iVar2;
  VariableStruct *pVVar3;
  
  do {
    iVar2 = this->Type;
    switch(iVar2) {
    case 0x2a:
    case 0x2d:
    case 0x2f:
      return 1;
    case 0x2b:
      this = this->Tree[0];
      break;
    case 0x2c:
    case 0x2e:
      return 0;
    default:
      uVar1 = iVar2 - 0x1c7;
      if (uVar1 < 0x2b) {
        if ((0x6f7f8000381U >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
          return 1;
        }
        if ((0x1040UL >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
          pVVar3 = VariableList::Lookup(Variables,&this->TextValue,this->Tree[0],0);
          if (pVVar3 == (VariableStruct *)0x0) {
            return 0;
          }
          if (9 < pVVar3->Type - VARTYPE_BYTE) {
            return 0;
          }
          return 1;
        }
      }
      if ((iVar2 - 0x3cU < 0x23) && ((0x400000005U >> ((ulong)(iVar2 - 0x3cU) & 0x3f) & 1) != 0)) {
        return 1;
      }
      if (iVar2 != 0x165) {
        return 0;
      }
      return 1;
    }
  } while( true );
}

Assistant:

int Node::IsNumber(void)
{
	VariableStruct *ThisVar;

	//
	// Try to figure out the variable type
	//
	switch (Type)
	{
	case BAS_V_FUNCTION:
	case BAS_V_NAME:
		//
		// Look for variable in table
		//
		ThisVar = Variables->Lookup(TextValue, Tree[0]);

		//
		// Print this variable
		//
		if (ThisVar != 0)
		{
			switch (ThisVar->Type)
			{
			case VARTYPE_BYTE:
			case VARTYPE_WORD:
			case VARTYPE_INTEGER:
			case VARTYPE_LONG:
			case VARTYPE_SINGLE:
			case VARTYPE_REAL:
			case VARTYPE_DOUBLE:
			case VARTYPE_HFLOAT:
			case VARTYPE_GFLOAT:
			case VARTYPE_DECIMAL:
				return 1;

			}
		}
		return 0;

	//
	// Sometomes used for strings.
	//
	case '+':
		return Tree[0]->IsNumber();

	//
	// Always Numeric
	//
	case '-':
	case '*':
	case '/':
	case '>':
	case '<':
	case BAS_S_MOD:
	case '^':
	case BAS_X_LAND:
	case BAS_S_EQV:
	case BAS_S_IMP:
	case BAS_X_GE:
	case BAS_X_LE:
	case BAS_P_NAME:
	case BAS_X_EQ:
	case BAS_X_NEQ:
	case BAS_S_NOT:
	case BAS_X_LNOT:
	case BAS_X_LOR:
	case BAS_S_OR:
	case BAS_N_UMINUS:
	case BAS_N_UPLUS:
	case BAS_S_XOR:
		return 1;

	// Easily a number
	//
	case BAS_V_INT:
	case BAS_V_INTEGER:
	case BAS_V_FLOAT:
		return(1);

	//
	// I don't know
	//
	default:
		return(0);
	}
}